

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.hpp
# Opt level: O3

pair<std::vector<char,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_> *
__thiscall
jessilib::
word_split_once<std::vector<char,std::allocator<char>>,__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,char>
          (pair<std::vector<char,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>
           *__return_storage_ptr__,jessilib *this,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> begin,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> end,
          char in_whitespace)

{
  jessilib jVar1;
  pointer pcVar2;
  pointer pcVar3;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> _Var4;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> __last;
  allocator_type local_89;
  pointer local_88;
  pointer pcStack_80;
  pointer local_78;
  pointer local_68;
  pointer pcStack_60;
  pointer local_58;
  pointer pcStack_50;
  pointer local_48;
  pointer pcStack_40;
  pointer local_38;
  pointer pcStack_30;
  
  local_48 = (pointer)0x0;
  pcStack_40 = (pointer)0x0;
  local_58 = (pointer)0x0;
  pcStack_50 = (pointer)0x0;
  local_68 = (pointer)0x0;
  pcStack_60 = (pointer)0x0;
  if (this < begin._M_current) {
    jVar1 = SUB81(end._M_current,0);
    do {
      __last._M_current = (char *)this;
      _Var4._M_current = (char *)this;
      if (*this != jVar1) break;
      this = this + 1;
      __last._M_current = begin._M_current;
      _Var4._M_current = begin._M_current;
    } while (this != (jessilib *)begin._M_current);
    do {
      if (__last._M_current == begin._M_current) goto LAB_003f230f;
      if ((jessilib)*__last._M_current == jVar1) {
        std::vector<char,std::allocator<char>>::
        vector<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,void>
                  ((vector<char,std::allocator<char>> *)&local_88,_Var4,__last,&local_89);
        pcVar3 = local_58;
        pcVar2 = local_68;
        local_68 = local_88;
        pcStack_60 = pcStack_80;
        local_58 = local_78;
        local_88 = (pointer)0x0;
        pcStack_80 = (pointer)0x0;
        local_78 = (pointer)0x0;
        if ((pcVar2 != (pointer)0x0) &&
           (operator_delete(pcVar2,(long)pcVar3 - (long)pcVar2), local_88 != (pointer)0x0)) {
          operator_delete(local_88,(long)local_78 - (long)local_88);
        }
        goto LAB_003f2412;
      }
      __last._M_current = __last._M_current + 1;
    } while( true );
  }
  (__return_storage_ptr__->first).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->first).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pcStack_40 = (pointer)0x0;
  (__return_storage_ptr__->first).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->second).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->second).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
LAB_003f2398:
  (__return_storage_ptr__->second).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pcStack_40;
  return __return_storage_ptr__;
LAB_003f230f:
  std::vector<char,std::allocator<char>>::
  vector<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,void>
            ((vector<char,std::allocator<char>> *)&local_88,_Var4,begin,&local_89);
  pcVar2 = local_78;
  local_38 = local_88;
  pcStack_30 = pcStack_80;
  local_88 = (pointer)0x0;
  pcStack_80 = (pointer)0x0;
  local_78 = (pointer)0x0;
  if ((local_68 != (pointer)0x0) &&
     (operator_delete(local_68,(long)local_58 - (long)local_68), local_88 != (pointer)0x0)) {
    operator_delete(local_88,(long)local_78 - (long)local_88);
  }
  (__return_storage_ptr__->first).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = local_38;
  (__return_storage_ptr__->first).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = pcStack_30;
  (__return_storage_ptr__->first).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pcVar2;
  (__return_storage_ptr__->second).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = pcStack_50;
  (__return_storage_ptr__->second).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = local_48;
  goto LAB_003f2398;
  while (_Var4._M_current = __last._M_current, (jessilib)*__last._M_current == jVar1) {
LAB_003f2412:
    __last._M_current = __last._M_current + 1;
    _Var4._M_current = begin._M_current;
    if (__last._M_current == begin._M_current) break;
  }
  std::vector<char,std::allocator<char>>::
  vector<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,void>
            ((vector<char,std::allocator<char>> *)&local_88,_Var4,begin,&local_89);
  pcVar2 = local_78;
  local_38 = local_88;
  pcStack_30 = pcStack_80;
  local_88 = (pointer)0x0;
  pcStack_80 = (pointer)0x0;
  local_78 = (pointer)0x0;
  if ((pcStack_50 != (pointer)0x0) &&
     (operator_delete(pcStack_50,(long)pcStack_40 - (long)pcStack_50), local_88 != (pointer)0x0)) {
    operator_delete(local_88,(long)local_78 - (long)local_88);
  }
  (__return_storage_ptr__->first).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = local_68;
  (__return_storage_ptr__->first).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = pcStack_60;
  (__return_storage_ptr__->first).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_58;
  (__return_storage_ptr__->second).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = local_38;
  (__return_storage_ptr__->second).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = pcStack_30;
  (__return_storage_ptr__->second).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pcVar2;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto word_split_once(ItrT begin, EndT end, ElementT in_whitespace) {
	static_assert(sizeof...(OptionalMemberT) <= 1, "Too many member types specified for OptionalMemberT");
	using MemberT = std::tuple_element_t<0, std::tuple<OptionalMemberT..., std::basic_string<ElementT>>>;

	std::pair<MemberT, MemberT> result;
	if (begin >= end) {
		// Nothing to word_split
		return result;
	}

	while (begin != end
		&& *begin == in_whitespace) {
		++begin;
	}

	for (auto itr = begin; itr != end; ++itr) {
		if (*itr == in_whitespace) {
			// in_whitespace found; word_split upon it
			result.first = make_word_split_member<MemberT>(begin, itr);

			++itr;
			while (itr != end
				&& *itr == in_whitespace) {
				++itr;
			}

			result.second = make_word_split_member<MemberT>(itr, end);
			return result;
		}
	}

	// in_whitespace not found
	result.first = make_word_split_member<MemberT>(begin, end);
	return result;
}